

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  uint uVar1;
  secp256k1_scalar *in_RDX;
  void *in_RSI;
  long in_RDI;
  int n_i;
  int j;
  int i;
  secp256k1_scalar gnb;
  secp256k1_ge_storage adds;
  secp256k1_ge add;
  int n;
  int g;
  int bits;
  secp256k1_ge *in_stack_00000190;
  secp256k1_gej *in_stack_00000198;
  secp256k1_gej *in_stack_000001a0;
  secp256k1_ge_storage *in_stack_ffffffffffffff18;
  int iVar2;
  int local_d8;
  secp256k1_scalar local_d4;
  undefined1 local_d0 [160];
  undefined4 local_30;
  int local_24;
  int local_20;
  uint local_1c;
  secp256k1_scalar *local_18;
  void *local_10;
  long local_8;
  
  local_1c = 4;
  local_20 = 0x10;
  local_24 = 0x40;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_d0,0,0x40);
  memcpy(local_10,(void *)(local_8 + 8),0x98);
  secp256k1_scalar_add(&local_d4,local_18,(secp256k1_scalar *)(local_8 + 4));
  local_30 = 0;
  for (local_d8 = 0; local_d8 < local_24; local_d8 = local_d8 + 1) {
    uVar1 = secp256k1_scalar_get_bits(&local_d4,local_d8 * local_1c,local_1c);
    for (iVar2 = 0; iVar2 < local_20; iVar2 = iVar2 + 1) {
      secp256k1_ge_storage_cmov
                ((secp256k1_ge_storage *)CONCAT44(iVar2,uVar1),in_stack_ffffffffffffff18,0);
    }
    secp256k1_ge_from_storage((secp256k1_ge *)CONCAT44(iVar2,uVar1),in_stack_ffffffffffffff18);
    secp256k1_gej_add_ge(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  secp256k1_ge_clear((secp256k1_ge *)0x10c58b);
  secp256k1_scalar_clear(&local_d4);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    int bits = ECMULT_GEN_PREC_BITS;
    int g = ECMULT_GEN_PREC_G(bits);
    int n = ECMULT_GEN_PREC_N(bits);

    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int i, j, n_i;
    
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (i = 0; i < n; i++) {
        n_i = secp256k1_scalar_get_bits(&gnb, i * bits, bits);
        for (j = 0; j < g; j++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (https://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &secp256k1_ecmult_gen_prec_table[i][j], j == n_i);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    n_i = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}